

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O2

string * Potassco::string_cast<Clasp::RestartParams::SeqUpdate>
                   (string *__return_storage_ptr__,SeqUpdate *num)

{
  Span<Potassco::KV> local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_20.first = (KV *)Clasp::enumMap(Clasp::RestartParams::SeqUpdate_const*)::map;
  local_20.size = 3;
  findKey(&local_20,*num);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string string_cast(const U& num) {
	std::string out;
	xconvert(out, num);
	return out;
}